

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-alloc-cb-fail.c
# Opt level: O1

void conn_read_cb(uv_stream_t *stream,ssize_t nread,uv_buf_t *buf)

{
  if (nread == -0x69) {
    if (buf->base == (char *)0x0) {
      if (buf->len == 0) {
        uv_close(&incoming,close_cb);
        uv_close(&client,close_cb);
        uv_close(&server,close_cb);
        return;
      }
      goto LAB_0016fe20;
    }
  }
  else {
    conn_read_cb_cold_1();
  }
  conn_read_cb_cold_2();
LAB_0016fe20:
  conn_read_cb_cold_3();
  close_cb_called = close_cb_called + 1;
  return;
}

Assistant:

static void conn_read_cb(uv_stream_t* stream,
                         ssize_t nread,
                         const uv_buf_t* buf) {
  ASSERT(nread == UV_ENOBUFS);
  ASSERT(buf->base == NULL);
  ASSERT(buf->len == 0);

  uv_close((uv_handle_t*) &incoming, close_cb);
  uv_close((uv_handle_t*) &client, close_cb);
  uv_close((uv_handle_t*) &server, close_cb);
}